

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

Type __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
AddMember<rapidjson::SchemaErrorCode>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,StringRefType *name,
          SchemaErrorCode value,CrtAllocator *allocator)

{
  Type pGVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> n;
  Data local_18;
  
  local_18.s.str = (Ch *)((ulong)name->s | 0x405000000000000);
  local_18.s.hashcode = 0;
  local_18.s.length = name->length;
  pGVar1 = AddMember<rapidjson::SchemaErrorCode>
                     (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                           &local_18.s,value,allocator);
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return pGVar1;
}

Assistant:

GenericStringRef(const GenericStringRef& rhs) : s(rhs.s), length(rhs.length) {}